

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_surface.cxx
# Opt level: O0

void __thiscall xray_re::xr_surface::load_0(xr_surface *this,xr_reader *r)

{
  bool bVar1;
  uint32_t uVar2;
  uint tc;
  xr_reader *r_local;
  xr_surface *this_local;
  
  xr_reader::r_sz(r,&this->m_name);
  xr_reader::r_sz(r,&this->m_eshader);
  std::__cxx11::string::operator=((string *)&this->m_cshader,"default");
  std::__cxx11::string::operator=((string *)&this->m_gamemtl,"default");
  bVar1 = xr_reader::r_bool(r);
  if (bVar1) {
    this->m_flags = 1;
  }
  uVar2 = xr_reader::r_u32(r);
  this->m_fvf = uVar2;
  uVar2 = xr_reader::r_u32(r);
  if (1 < uVar2) {
    __assert_fail("tc <= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_surface.cxx"
                  ,0x38,"void xray_re::xr_surface::load_0(xr_reader &)");
  }
  xr_reader::r_sz(r,&this->m_texture);
  xr_reader::r_sz(r,&this->m_vmap);
  return;
}

Assistant:

void xr_surface::load_0(xr_reader& r)
{
	r.r_sz(m_name);
	r.r_sz(m_eshader);
	m_cshader = "default";
	m_gamemtl = "default";
	if (r.r_bool())
		m_flags = ESF_TWO_SIDED;
	m_fvf = r.r_u32();
	unsigned tc = r.r_u32();
	xr_assert(tc <= 1);
	r.r_sz(m_texture);
	r.r_sz(m_vmap);
}